

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbarextension.cpp
# Opt level: O0

void __thiscall QToolBarExtension::setOrientation(QToolBarExtension *this,Orientation o)

{
  QStyle *pQVar1;
  int in_ESI;
  QStyleOption *in_RDI;
  long in_FS_OFFSET;
  QStyleOption opt;
  QWidget *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff98;
  QStyleOption *widget;
  QIcon in_stack_ffffffffffffffa8;
  QIcon local_50;
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  widget = in_RDI;
  memset(local_48,0xaa,0x40);
  QStyleOption::QStyleOption
            ((QStyleOption *)in_stack_ffffffffffffffa8.d,(int)((ulong)widget >> 0x20),(int)widget);
  QStyleOption::initFrom((QStyleOption *)in_stack_ffffffffffffffa8.d,(QWidget *)widget);
  if (in_ESI == 1) {
    pQVar1 = QWidget::style(in_stack_ffffffffffffff88);
    (**(code **)(*(long *)pQVar1 + 0x100))(&local_50,pQVar1,0x1b,local_48,in_RDI);
    QAbstractButton::setIcon
              ((QAbstractButton *)widget,(QIcon *)CONCAT44(in_ESI,in_stack_ffffffffffffff98));
    QIcon::~QIcon(&local_50);
  }
  else {
    pQVar1 = QWidget::style(in_stack_ffffffffffffff88);
    (**(code **)(*(long *)pQVar1 + 0x100))(&stack0xffffffffffffffa8,pQVar1,0x1c,local_48,in_RDI);
    QAbstractButton::setIcon
              ((QAbstractButton *)widget,(QIcon *)CONCAT44(in_ESI,in_stack_ffffffffffffff98));
    QIcon::~QIcon((QIcon *)&stack0xffffffffffffffa8);
  }
  *(int *)&(in_RDI->palette).d = in_ESI;
  QStyleOption::~QStyleOption(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QToolBarExtension::setOrientation(Qt::Orientation o)
{
    QStyleOption opt;
    opt.initFrom(this);
    if (o == Qt::Horizontal) {
        setIcon(style()->standardIcon(QStyle::SP_ToolBarHorizontalExtensionButton, &opt, this));
    } else {
        setIcon(style()->standardIcon(QStyle::SP_ToolBarVerticalExtensionButton, &opt, this));
    }
    m_orientation = o;
}